

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionDirWrapper.cpp
# Opt level: O1

void * __thiscall
ExceptionEntryWrapper::getFieldPtr(ExceptionEntryWrapper *this,size_t fieldId,size_t subField)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar4;
  undefined4 extraout_var_01;
  ARM_EXCEPT_RECORD *rec;
  void *pvVar3;
  
  iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  pvVar3 = (void *)CONCAT44(extraout_var,iVar2);
  if (pvVar3 == (void *)0x0) {
    return (void *)0x0;
  }
  iVar2 = (*(((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)
            ._vptr_AbstractByteBuffer[0xc])();
  pvVar4 = (void *)CONCAT44(extraout_var_00,iVar2);
  if (iVar2 == 1) {
    if (fieldId == 0) {
LAB_0013845c:
      bVar1 = false;
      pvVar4 = pvVar3;
      goto LAB_00138465;
    }
    if (fieldId != 2) goto LAB_0013844b;
    pvVar4 = (void *)((long)pvVar3 + 8);
  }
  else {
    iVar2 = (*(((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe)->
              super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xc])();
    if (iVar2 != 2) {
      return pvVar3;
    }
    iVar2 = (*(((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe)->
              super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xb])();
    pvVar4 = (void *)CONCAT44(extraout_var_01,iVar2);
    if (iVar2 != 0x40) {
      return pvVar3;
    }
    if (fieldId == 0) goto LAB_0013845c;
LAB_0013844b:
    if (fieldId != 1) {
      bVar1 = true;
      goto LAB_00138465;
    }
    pvVar4 = (void *)((long)pvVar3 + 4);
  }
  bVar1 = false;
LAB_00138465:
  if (bVar1) {
    return pvVar3;
  }
  return pvVar4;
}

Assistant:

void* ExceptionEntryWrapper::getFieldPtr(size_t fieldId, size_t subField)
{
    void *ptr = this->getPtr();
    if (!ptr) return nullptr;
    
    if (this->m_Exe->getArch() == Executable::ARCH_INTEL) {
        IMAGE_IA64_RUNTIME_FUNCTION_ENTRY* exc = (IMAGE_IA64_RUNTIME_FUNCTION_ENTRY*) ptr;
        if (!exc) return NULL;

        switch (fieldId) {
            case BEGIN_ADDR : return &exc->BeginAddress;
            case END_ADDR : return &exc->EndAddress;
            case UNWIND_INFO_ADDR : return &exc->UnwindInfoAddress;
        }
    }
    else if (this->m_Exe->getArch() == Executable::ARCH_ARM && this->m_Exe->getBitMode() == 64) {
        ARM_EXCEPT_RECORD *rec = (ARM_EXCEPT_RECORD*) ptr;
        if (!rec) return NULL;
        
        switch (fieldId) {
            case ARM_EXCEPT_START : return &rec->Start;
            case ARM_EXCEPT_XDATA : return &rec->Xdata;
        }
    }
    return ptr;
}